

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.h
# Opt level: O0

void __thiscall
ON_ClippingPlaneSurface::ON_ClippingPlaneSurface
          (ON_ClippingPlaneSurface *this,ON_ClippingPlaneSurface *param_1)

{
  ON_ClippingPlaneSurface *param_1_local;
  ON_ClippingPlaneSurface *this_local;
  
  ON_PlaneSurface::ON_PlaneSurface(&this->super_ON_PlaneSurface,&param_1->super_ON_PlaneSurface);
  (this->super_ON_PlaneSurface).super_ON_Surface.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00b76528;
  ON_ClippingPlane::ON_ClippingPlane(&this->m_clipping_plane,&param_1->m_clipping_plane);
  return;
}

Assistant:

class ON_CLASS ON_ClippingPlaneSurface : public ON_PlaneSurface
{
  ON_OBJECT_DECLARE(ON_ClippingPlaneSurface);
public:
  ON_ClippingPlaneSurface();
  ON_ClippingPlaneSurface(const ON_Plane& src);
  ON_ClippingPlaneSurface(const ON_PlaneSurface& src);
  ~ON_ClippingPlaneSurface();

  ON_ClippingPlaneSurface& operator=(const ON_Plane& src);
  ON_ClippingPlaneSurface& operator=(const ON_PlaneSurface& src);

  void Default();

  // override ON_Object::ObjectType() - returns ON::clipplane_object
  ON::object_type ObjectType() const override;

  // virtual ON_Object::SizeOf override
  unsigned int SizeOf() const override;

  // virtual ON_Object::DataCRC override
  ON__UINT32 DataCRC(ON__UINT32 current_remainder) const override;

  // virtual ON_Object::Dump override
  void Dump( ON_TextLog& ) const override; // for debugging

  // virtual ON_Object::Write override
  bool Write(
         ON_BinaryArchive&  // open binary file
       ) const override;

  // virtual ON_Object::Read override
  bool Read(
         ON_BinaryArchive&  // open binary file
       ) override;

  ON_ClippingPlane m_clipping_plane;
}